

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sw_striped_avx2_256_64.c
# Opt level: O0

parasail_result_t *
parasail_sw_striped_profile_avx2_256_64
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap)

{
  long lVar1;
  long lVar2;
  undefined1 auVar3 [32];
  __m256i a;
  __m256i alVar4;
  __m256i c;
  __m256i b;
  __m256i b_00;
  __m256i b_01;
  __m256i b_02;
  __m256i b_03;
  __m256i b_04;
  __m256i b_05;
  __m256i b_06;
  __m256i a_00;
  __m256i a_01;
  __m256i a_02;
  __m256i a_03;
  __m256i a_04;
  __m256i a_05;
  __m256i a_06;
  __m256i a_07;
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  int iVar16;
  int iVar17;
  ulong uVar18;
  __m256i *ptr;
  long lVar19;
  longlong *plVar20;
  __m256i *palVar21;
  int in_ECX;
  int in_EDX;
  long in_RSI;
  long in_RDI;
  int in_R8D;
  long lVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  long lVar30;
  long lVar31;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  long lVar32;
  long lVar33;
  undefined1 auVar34 [16];
  long lVar35;
  long lVar36;
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  int32_t temp;
  int32_t column_len;
  int64_t *t;
  __m256i *pv_2;
  __m256i *pv_1;
  __m256i vCompare;
  __m256i *pv;
  __m256i *vP;
  __m256i vH;
  __m256i vF;
  __m256i vE;
  parasail_result_t *result;
  int64_t maxp;
  __m256i vMaxHUnit;
  __m256i vMaxH;
  int64_t score;
  __m256i vNegInf;
  __m256i vZero;
  __m256i vGapE;
  __m256i vGapO;
  __m256i *pvE;
  __m256i *pvHMax;
  __m256i *pvHLoad;
  __m256i *pvHStore;
  __m256i *vProfile;
  int32_t segLen;
  int32_t segWidth;
  parasail_matrix_t *matrix;
  int32_t s1Len;
  int32_t end_ref;
  int32_t end_query;
  int32_t k;
  int32_t j;
  int32_t i;
  undefined1 in_stack_fffffffffffff8a0 [16];
  size_t in_stack_fffffffffffff8b0;
  undefined4 in_stack_fffffffffffff8b8;
  undefined4 in_stack_fffffffffffff8bc;
  undefined4 in_stack_fffffffffffff8c0;
  undefined4 in_stack_fffffffffffff8c4;
  undefined8 in_stack_fffffffffffff8c8;
  longlong *plVar45;
  longlong in_stack_fffffffffffff8d0;
  __m256i *in_stack_fffffffffffff8f0;
  long in_stack_fffffffffffff8f8;
  undefined1 in_stack_fffffffffffff900 [16];
  longlong *plVar46;
  undefined8 uVar47;
  undefined8 uVar48;
  longlong lVar49;
  long lVar50;
  long lStack_6c8;
  undefined1 local_6c0 [32];
  longlong local_6a0;
  longlong lStack_698;
  longlong lStack_690;
  longlong lStack_688;
  undefined8 uStack_650;
  undefined8 uStack_648;
  undefined8 uStack_630;
  undefined8 uStack_628;
  ulong local_608;
  longlong *local_578;
  longlong *local_570;
  longlong *local_568;
  int local_540;
  int local_53c;
  int local_538;
  int local_534;
  int local_530;
  parasail_result_t *local_510;
  ulong uStack_4d8;
  undefined8 uStack_170;
  undefined8 uStack_168;
  undefined8 uStack_130;
  undefined8 uStack_128;
  
  if (in_RDI == 0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_sw_striped_profile_avx2_256_64","profile");
    local_510 = (parasail_result_t *)0x0;
  }
  else if (*(long *)(in_RDI + 0x60) == 0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_sw_striped_profile_avx2_256_64",
            "profile->profile64.score");
    local_510 = (parasail_result_t *)0x0;
  }
  else if (*(long *)(in_RDI + 0x10) == 0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_sw_striped_profile_avx2_256_64","profile->matrix");
    local_510 = (parasail_result_t *)0x0;
  }
  else if (*(int *)(in_RDI + 8) < 1) {
    fprintf(_stderr,"%s: %s must be > 0\n","parasail_sw_striped_profile_avx2_256_64",
            "profile->s1Len");
    local_510 = (parasail_result_t *)0x0;
  }
  else if (in_RSI == 0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_sw_striped_profile_avx2_256_64","s2");
    local_510 = (parasail_result_t *)0x0;
  }
  else if (in_EDX < 1) {
    fprintf(_stderr,"%s: %s must be > 0\n","parasail_sw_striped_profile_avx2_256_64","s2Len");
    local_510 = (parasail_result_t *)0x0;
  }
  else if (in_ECX < 0) {
    fprintf(_stderr,"%s: %s must be >= 0\n","parasail_sw_striped_profile_avx2_256_64","open");
    local_510 = (parasail_result_t *)0x0;
  }
  else if (in_R8D < 0) {
    fprintf(_stderr,"%s: %s must be >= 0\n","parasail_sw_striped_profile_avx2_256_64","gap");
    local_510 = (parasail_result_t *)0x0;
  }
  else {
    local_540 = 0;
    local_53c = *(int *)(in_RDI + 8);
    lVar1 = *(long *)(in_RDI + 0x10);
    iVar16 = (local_53c + 3) / 4;
    lVar2 = *(long *)(in_RDI + 0x60);
    uVar18 = (ulong)in_ECX;
    auVar23._8_8_ = 0;
    auVar23._0_8_ = uVar18;
    auVar34._8_8_ = 0;
    auVar34._0_8_ = uVar18;
    auVar23 = vpunpcklqdq_avx(auVar23,auVar34);
    auVar25._8_8_ = 0;
    auVar25._0_8_ = uVar18;
    auVar41._8_8_ = 0;
    auVar41._0_8_ = uVar18;
    auVar24 = vpunpcklqdq_avx(auVar25,auVar41);
    uStack_170 = auVar24._0_8_;
    uStack_168 = auVar24._8_8_;
    uVar18 = (ulong)in_R8D;
    auVar24._8_8_ = 0;
    auVar24._0_8_ = uVar18;
    auVar37._8_8_ = 0;
    auVar37._0_8_ = uVar18;
    auVar24 = vpunpcklqdq_avx(auVar24,auVar37);
    auVar38._8_8_ = 0;
    auVar38._0_8_ = uVar18;
    auVar42._8_8_ = 0;
    auVar42._0_8_ = uVar18;
    auVar34 = vpunpcklqdq_avx(auVar38,auVar42);
    uStack_130 = auVar34._0_8_;
    uStack_128 = auVar34._8_8_;
    uStack_4d8 = SUB328(ZEXT832(0),4);
    auVar34 = vpunpcklqdq_avx(ZEXT816(0xc000000000000000),ZEXT816(0xc000000000000000));
    auVar25 = vpunpcklqdq_avx(ZEXT816(0xc000000000000000),ZEXT816(0xc000000000000000));
    auVar25 = ZEXT116(0) * auVar34 + ZEXT116(1) * auVar25;
    auVar34 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar34;
    local_608 = 0xc000000000000000;
    iVar17 = *(int *)(lVar1 + 0x1c);
    local_510 = parasail_result_new();
    if (local_510 == (parasail_result_t *)0x0) {
      local_510 = (parasail_result_t *)0x0;
    }
    else {
      local_510->flag = local_510->flag | 0x4800804;
      local_568 = *parasail_memalign___m256i(0x20,(long)iVar16);
      local_570 = *parasail_memalign___m256i(0x20,(long)iVar16);
      local_578 = *parasail_memalign___m256i(0x20,(long)iVar16);
      ptr = parasail_memalign___m256i(0x20,(long)iVar16);
      if ((__m256i *)local_568 == (__m256i *)0x0) {
        local_510 = (parasail_result_t *)0x0;
      }
      else if (local_570 == (longlong *)0x0) {
        local_510 = (parasail_result_t *)0x0;
      }
      else if (local_578 == (longlong *)0x0) {
        local_510 = (parasail_result_t *)0x0;
      }
      else if (ptr == (__m256i *)0x0) {
        local_510 = (parasail_result_t *)0x0;
      }
      else {
        alVar4[0]._4_4_ = in_stack_fffffffffffff8bc;
        alVar4[0]._0_4_ = in_stack_fffffffffffff8b8;
        alVar4[1]._0_4_ = in_stack_fffffffffffff8c0;
        alVar4[1]._4_4_ = in_stack_fffffffffffff8c4;
        alVar4[2] = in_stack_fffffffffffff8c8;
        alVar4[3] = in_stack_fffffffffffff8d0;
        parasail_memset___m256i(in_stack_fffffffffffff8f0,alVar4,in_stack_fffffffffffff8b0);
        uVar18 = (ulong)-in_ECX;
        auVar26._8_8_ = 0;
        auVar26._0_8_ = uVar18;
        auVar39._8_8_ = 0;
        auVar39._0_8_ = uVar18;
        vpunpcklqdq_avx(auVar26,auVar39);
        auVar27._8_8_ = 0;
        auVar27._0_8_ = uVar18;
        auVar43._8_8_ = 0;
        auVar43._0_8_ = uVar18;
        vpunpcklqdq_avx(auVar27,auVar43);
        c[0]._4_4_ = in_stack_fffffffffffff8bc;
        c[0]._0_4_ = in_stack_fffffffffffff8b8;
        c[1]._0_4_ = in_stack_fffffffffffff8c0;
        c[1]._4_4_ = in_stack_fffffffffffff8c4;
        c[2] = in_stack_fffffffffffff8c8;
        c[3] = in_stack_fffffffffffff8d0;
        parasail_memset___m256i(in_stack_fffffffffffff8f0,c,in_stack_fffffffffffff8b0);
        local_534 = 0;
        auVar14 = auVar25;
        auVar15 = auVar34;
        while( true ) {
          plVar45 = local_578;
          uStack_648 = auVar34._8_8_;
          uStack_650 = auVar34._0_8_;
          if (in_EDX <= local_534) break;
          local_6c0 = ZEXT832(uStack_4d8) << 0x40;
          auVar3 = vpermq_avx2(*(undefined1 (*) [32])(local_568 + (long)(iVar16 + -1) * 4),0x90);
          auVar3 = vpblendd_avx2(auVar3,ZEXT1632(ZEXT816(0) << 0x40),3);
          lVar35 = auVar3._0_8_;
          lVar31 = auVar3._8_8_;
          lVar33 = auVar3._16_8_;
          lStack_6c8 = auVar3._24_8_;
          lVar19 = lVar2 + (long)(*(int *)(*(long *)(lVar1 + 0x10) +
                                          (ulong)*(byte *)(in_RSI + local_534) * 4) * iVar16) * 0x20
          ;
          plVar46 = local_570;
          if (local_540 == local_534 + -2) {
            local_578 = local_570;
            plVar46 = plVar45;
          }
          local_570 = local_568;
          plVar45 = plVar46;
          for (local_530 = 0; local_530 < iVar16; local_530 = local_530 + 1) {
            auVar3._8_8_ = lVar31;
            auVar3._0_8_ = lVar35;
            auVar3._16_8_ = lVar33;
            auVar3._24_8_ = lStack_6c8;
            auVar3 = vpaddq_avx2(auVar3,*(undefined1 (*) [32])(lVar19 + (long)local_530 * 0x20));
            lVar22 = auVar3._0_8_;
            lVar30 = auVar3._8_8_;
            lVar32 = auVar3._16_8_;
            lStack_6c8 = auVar3._24_8_;
            alVar4 = ptr[local_530];
            a_00[1] = lVar22;
            a_00[0] = lVar19;
            a_00[2] = lVar30;
            a_00[3] = lVar32;
            b[1] = in_stack_fffffffffffff900._0_8_;
            b[2] = in_stack_fffffffffffff900._8_8_;
            b[0] = in_stack_fffffffffffff8f8;
            b[3] = (longlong)plVar45;
            _mm256_max_epi64_rpl(a_00,b);
            a_01[1] = lVar22;
            a_01[0] = lVar19;
            a_01[2] = lVar30;
            a_01[3] = lVar32;
            b_00[1] = in_stack_fffffffffffff900._0_8_;
            b_00[2] = in_stack_fffffffffffff900._8_8_;
            b_00[0] = in_stack_fffffffffffff8f8;
            b_00[3] = (longlong)plVar45;
            _mm256_max_epi64_rpl(a_01,b_00);
            a_02[1] = lVar22;
            a_02[0] = lVar19;
            a_02[2] = lVar30;
            a_02[3] = lVar32;
            b_01[1] = in_stack_fffffffffffff900._0_8_;
            b_01[2] = in_stack_fffffffffffff900._8_8_;
            b_01[0] = in_stack_fffffffffffff8f8;
            b_01[3] = (longlong)plVar45;
            _mm256_max_epi64_rpl(a_02,b_01);
            plVar20 = plVar46 + (long)local_530 * 4;
            *plVar20 = lVar22;
            plVar20[1] = lVar30;
            plVar20[2] = lVar32;
            plVar20[3] = lStack_6c8;
            a_03[1] = lVar22;
            a_03[0] = lVar19;
            a_03[2] = lVar30;
            a_03[3] = lVar32;
            b_02[1] = in_stack_fffffffffffff900._0_8_;
            b_02[2] = in_stack_fffffffffffff900._8_8_;
            b_02[0] = in_stack_fffffffffffff8f8;
            b_02[3] = (longlong)plVar45;
            lVar35 = lStack_6c8;
            lVar31 = lVar22;
            lVar33 = lVar30;
            lVar36 = lVar32;
            _mm256_max_epi64_rpl(a_03,b_02);
            auVar15._8_8_ = lVar35;
            auVar15._0_8_ = lVar32;
            auVar14._8_8_ = lVar30;
            auVar14._0_8_ = lVar22;
            auVar11._8_8_ = lVar33;
            auVar11._0_8_ = lVar31;
            auVar11._16_8_ = lVar36;
            auVar11._24_8_ = lStack_6c8;
            auVar10._16_8_ = uStack_170;
            auVar10._0_16_ = auVar23;
            auVar10._24_8_ = uStack_168;
            auVar3 = vpsubq_avx2(auVar11,auVar10);
            uVar47 = auVar3._0_8_;
            uVar48 = auVar3._8_8_;
            lVar49 = auVar3._16_8_;
            auVar9._16_8_ = uStack_130;
            auVar9._0_16_ = auVar24;
            auVar9._24_8_ = uStack_128;
            auVar3 = vpsubq_avx2((undefined1  [32])alVar4,auVar9);
            local_6a0 = auVar3._0_8_;
            lStack_698 = auVar3._8_8_;
            lStack_690 = auVar3._16_8_;
            lStack_688 = auVar3._24_8_;
            a_04[1] = uVar47;
            a_04[0] = lVar19;
            a_04[2] = uVar48;
            a_04[3] = lVar49;
            b_03[1] = in_stack_fffffffffffff900._0_8_;
            b_03[2] = in_stack_fffffffffffff900._8_8_;
            b_03[0] = in_stack_fffffffffffff8f8;
            b_03[3] = (longlong)plVar45;
            _mm256_max_epi64_rpl(a_04,b_03);
            palVar21 = ptr + local_530;
            (*palVar21)[0] = local_6a0;
            (*palVar21)[1] = lStack_698;
            (*palVar21)[2] = lStack_690;
            (*palVar21)[3] = lStack_688;
            auVar8._16_8_ = uStack_130;
            auVar8._0_16_ = auVar24;
            auVar8._24_8_ = uStack_128;
            auVar3 = vpsubq_avx2(local_6c0,auVar8);
            local_6c0._0_8_ = auVar3._0_8_;
            local_6c0._8_8_ = auVar3._8_8_;
            local_6c0._16_8_ = auVar3._16_8_;
            local_6c0._24_8_ = auVar3._24_8_;
            a_05[1] = uVar47;
            a_05[0] = lVar19;
            a_05[2] = uVar48;
            a_05[3] = lVar49;
            b_04[1] = in_stack_fffffffffffff900._0_8_;
            b_04[2] = in_stack_fffffffffffff900._8_8_;
            b_04[0] = in_stack_fffffffffffff8f8;
            b_04[3] = (longlong)plVar45;
            _mm256_max_epi64_rpl(a_05,b_04);
            plVar20 = local_568 + (long)local_530 * 4;
            lVar35 = *plVar20;
            lVar31 = plVar20[1];
            lVar33 = plVar20[2];
            lStack_6c8 = plVar20[3];
          }
          for (local_538 = 0; local_538 < 4; local_538 = local_538 + 1) {
            auVar3 = vpermq_avx2(local_6c0,0x90);
            local_6c0 = vpblendd_avx2(auVar3,ZEXT1632(ZEXT816(0) << 0x40),3);
            for (local_530 = 0; local_530 < iVar16; local_530 = local_530 + 1) {
              plVar20 = plVar46 + (long)local_530 * 4;
              lVar35 = *plVar20;
              lVar31 = plVar20[1];
              lVar33 = plVar20[2];
              lVar36 = plVar20[3];
              a_06[1] = lVar35;
              a_06[0] = lVar19;
              a_06[2] = lVar31;
              a_06[3] = lVar33;
              b_05[1] = in_stack_fffffffffffff900._0_8_;
              b_05[2] = in_stack_fffffffffffff900._8_8_;
              b_05[0] = in_stack_fffffffffffff8f8;
              b_05[3] = (longlong)plVar45;
              _mm256_max_epi64_rpl(a_06,b_05);
              plVar20 = plVar46 + (long)local_530 * 4;
              *plVar20 = lVar35;
              plVar20[1] = lVar31;
              plVar20[2] = lVar33;
              plVar20[3] = lVar36;
              a_07[1] = lVar35;
              a_07[0] = lVar19;
              a_07[2] = lVar31;
              a_07[3] = lVar33;
              b_06[1] = in_stack_fffffffffffff900._0_8_;
              b_06[2] = in_stack_fffffffffffff900._8_8_;
              b_06[0] = in_stack_fffffffffffff8f8;
              b_06[3] = (longlong)plVar45;
              lVar22 = lVar36;
              lVar30 = lVar35;
              lVar32 = lVar31;
              lVar50 = lVar33;
              _mm256_max_epi64_rpl(a_07,b_06);
              auVar15._8_8_ = lVar22;
              auVar15._0_8_ = lVar33;
              auVar14._8_8_ = lVar31;
              auVar14._0_8_ = lVar35;
              auVar7._8_8_ = lVar32;
              auVar7._0_8_ = lVar30;
              auVar7._16_8_ = lVar50;
              auVar7._24_8_ = lVar36;
              auVar6._16_8_ = uStack_170;
              auVar6._0_16_ = auVar23;
              auVar6._24_8_ = uStack_168;
              auVar3 = vpsubq_avx2(auVar7,auVar6);
              auVar5._16_8_ = uStack_130;
              auVar5._0_16_ = auVar24;
              auVar5._24_8_ = uStack_128;
              local_6c0 = vpsubq_avx2(local_6c0,auVar5);
              auVar3 = vpcmpgtq_avx2(local_6c0,auVar3);
              if ((((((((((((((((((((((((((((((((auVar3 >> 7 & (undefined1  [32])0x1) ==
                                                (undefined1  [32])0x0 &&
                                               (auVar3 >> 0xf & (undefined1  [32])0x1) ==
                                               (undefined1  [32])0x0) &&
                                              (auVar3 >> 0x17 & (undefined1  [32])0x1) ==
                                              (undefined1  [32])0x0) &&
                                             (auVar3 >> 0x1f & (undefined1  [32])0x1) ==
                                             (undefined1  [32])0x0) &&
                                            (auVar3 >> 0x27 & (undefined1  [32])0x1) ==
                                            (undefined1  [32])0x0) &&
                                           (auVar3 >> 0x2f & (undefined1  [32])0x1) ==
                                           (undefined1  [32])0x0) &&
                                          (auVar3 >> 0x37 & (undefined1  [32])0x1) ==
                                          (undefined1  [32])0x0) &&
                                         (auVar3 >> 0x3f & (undefined1  [32])0x1) ==
                                         (undefined1  [32])0x0) &&
                                        (auVar3 >> 0x47 & (undefined1  [32])0x1) ==
                                        (undefined1  [32])0x0) &&
                                       (auVar3 >> 0x4f & (undefined1  [32])0x1) ==
                                       (undefined1  [32])0x0) &&
                                      (auVar3 >> 0x57 & (undefined1  [32])0x1) ==
                                      (undefined1  [32])0x0) &&
                                     (auVar3 >> 0x5f & (undefined1  [32])0x1) ==
                                     (undefined1  [32])0x0) &&
                                    (auVar3 >> 0x67 & (undefined1  [32])0x1) ==
                                    (undefined1  [32])0x0) &&
                                   (auVar3 >> 0x6f & (undefined1  [32])0x1) == (undefined1  [32])0x0
                                   ) && (auVar3 >> 0x77 & (undefined1  [32])0x1) ==
                                        (undefined1  [32])0x0) && SUB321(auVar3 >> 0x7f,0) == '\0')
                                && (auVar3 >> 0x87 & (undefined1  [32])0x1) == (undefined1  [32])0x0
                                ) && (auVar3 >> 0x8f & (undefined1  [32])0x1) ==
                                     (undefined1  [32])0x0) &&
                              (auVar3 >> 0x97 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                             (auVar3 >> 0x9f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                            (auVar3 >> 0xa7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                           (auVar3 >> 0xaf & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                          (auVar3 >> 0xb7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                         SUB321(auVar3 >> 0xbf,0) == '\0') &&
                        (auVar3 >> 199 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       (auVar3 >> 0xcf & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (auVar3 >> 0xd7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     (auVar3 >> 0xdf & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar3 >> 0xe7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   (auVar3 >> 0xef & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar3 >> 0xf7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  -1 < auVar3[0x1f]) goto LAB_00bc20e9;
            }
          }
LAB_00bc20e9:
          uStack_628 = auVar15._8_8_;
          uStack_630 = auVar15._0_8_;
          auVar13._16_8_ = uStack_630;
          auVar13._0_16_ = auVar14;
          auVar13._24_8_ = uStack_628;
          auVar12._16_8_ = uStack_650;
          auVar12._0_16_ = auVar25;
          auVar12._24_8_ = uStack_648;
          auVar3 = vpcmpgtq_avx2(auVar13,auVar12);
          in_stack_fffffffffffff8f8 = auVar3._24_8_;
          local_568 = plVar46;
          if ((((((((((((((((((((((((((((((((auVar3 >> 7 & (undefined1  [32])0x1) !=
                                            (undefined1  [32])0x0 ||
                                           (auVar3 >> 0xf & (undefined1  [32])0x1) !=
                                           (undefined1  [32])0x0) ||
                                          (auVar3 >> 0x17 & (undefined1  [32])0x1) !=
                                          (undefined1  [32])0x0) ||
                                         (auVar3 >> 0x1f & (undefined1  [32])0x1) !=
                                         (undefined1  [32])0x0) ||
                                        (auVar3 >> 0x27 & (undefined1  [32])0x1) !=
                                        (undefined1  [32])0x0) ||
                                       (auVar3 >> 0x2f & (undefined1  [32])0x1) !=
                                       (undefined1  [32])0x0) ||
                                      (auVar3 >> 0x37 & (undefined1  [32])0x1) !=
                                      (undefined1  [32])0x0) ||
                                     (auVar3 >> 0x3f & (undefined1  [32])0x1) !=
                                     (undefined1  [32])0x0) ||
                                    (auVar3 >> 0x47 & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0) ||
                                   (auVar3 >> 0x4f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                                   ) || (auVar3 >> 0x57 & (undefined1  [32])0x1) !=
                                        (undefined1  [32])0x0) ||
                                 (auVar3 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0)
                                || (auVar3 >> 0x67 & (undefined1  [32])0x1) != (undefined1  [32])0x0
                                ) || (auVar3 >> 0x6f & (undefined1  [32])0x1) !=
                                     (undefined1  [32])0x0) ||
                              (auVar3 >> 0x77 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                             SUB321(auVar3 >> 0x7f,0) != '\0') ||
                            (auVar3 >> 0x87 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                           (auVar3 >> 0x8f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                          (auVar3 >> 0x97 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         (auVar3 >> 0x9f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (auVar3 >> 0xa7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       (auVar3 >> 0xaf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar3 >> 0xb7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar3 >> 0xbf,0) != '\0') ||
                    (auVar3 >> 199 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   (auVar3 >> 0xcf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar3 >> 0xd7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 (auVar3 >> 0xdf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar3 >> 0xe7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               (auVar3 >> 0xef & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar3 >> 0xf7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              in_stack_fffffffffffff8f8 < 0) {
            a[1] = in_stack_fffffffffffff8a0._0_8_;
            a[2] = in_stack_fffffffffffff8a0._8_8_;
            a[0] = 0xbc215d;
            a[3] = in_stack_fffffffffffff8b0;
            local_608 = _mm256_hmax_epi64_rpl(a);
            if (0x7fffffffffffffff - (long)(iVar17 + 1) < (long)local_608) {
              local_510->flag = local_510->flag | 0x40;
              break;
            }
            auVar28._8_8_ = 0;
            auVar28._0_8_ = local_608;
            auVar40._8_8_ = 0;
            auVar40._0_8_ = local_608;
            auVar34 = vpunpcklqdq_avx(auVar28,auVar40);
            auVar29._8_8_ = 0;
            auVar29._0_8_ = local_608;
            auVar44._8_8_ = 0;
            auVar44._0_8_ = local_608;
            auVar25 = vpunpcklqdq_avx(auVar29,auVar44);
            auVar25 = ZEXT116(0) * auVar34 + ZEXT116(1) * auVar25;
            auVar34 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar34;
            local_540 = local_534;
          }
          local_534 = local_534 + 1;
        }
        plVar45 = local_578;
        if (local_608 == 0x7fffffffffffffff) {
          local_510->flag = local_510->flag | 0x40;
        }
        iVar17 = parasail_result_is_saturated(local_510);
        if (iVar17 == 0) {
          if (local_540 == local_534 + -1) {
            local_578 = local_568;
            local_568 = plVar45;
          }
          else if (local_540 == local_534 + -2) {
            local_578 = local_570;
            local_570 = plVar45;
          }
          local_53c = local_53c + -1;
          plVar45 = local_578;
          for (local_530 = 0; local_530 < iVar16 * 4; local_530 = local_530 + 1) {
            if ((*plVar45 == local_608) &&
               (iVar17 = local_530 / 4 + (local_530 % 4) * iVar16, iVar17 < local_53c)) {
              local_53c = iVar17;
            }
            plVar45 = plVar45 + 1;
          }
        }
        else {
          local_608 = 0x7fffffffffffffff;
          local_53c = 0;
          local_540 = 0;
        }
        local_510->score = (int)local_608;
        local_510->end_query = local_53c;
        local_510->end_ref = local_540;
        parasail_free(ptr);
        parasail_free(local_578);
        parasail_free(local_570);
        parasail_free(local_568);
      }
    }
  }
  return local_510;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    int32_t s1Len = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
#ifdef PARASAIL_ROWCOL
    int32_t offset = 0;
    int32_t position = 0;
#endif
    __m256i* restrict vProfile = NULL;
    __m256i* restrict pvHStore = NULL;
    __m256i* restrict pvHLoad = NULL;
    __m256i* restrict pvHMax = NULL;
    __m256i* restrict pvE = NULL;
    __m256i vGapO;
    __m256i vGapE;
    __m256i vZero;
    __m256i vNegInf;
    int64_t score = 0;
    __m256i vMaxH;
    __m256i vMaxHUnit;
    int64_t maxp = 0;
    /*int64_t stop = 0;*/
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile64.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    k = 0;
    end_query = 0;
    end_ref = 0;
    s1Len = profile->s1Len;
    matrix = profile->matrix;
    segWidth = 4; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
#ifdef PARASAIL_ROWCOL
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
#endif
    vProfile = (__m256i*)profile->profile64.score;
    vGapO = _mm256_set1_epi64x_rpl(open);
    vGapE = _mm256_set1_epi64x_rpl(gap);
    vZero = _mm256_setzero_si256();
    vNegInf = _mm256_set1_epi64x_rpl(NEG_INF);
    score = NEG_INF;
    vMaxH = vNegInf;
    vMaxHUnit = vNegInf;
    maxp = INT64_MAX - (int64_t)(matrix->max+1);
    /*stop = profile->stop == INT32_MAX ?  INT64_MAX : (int64_t)profile->stop;*/

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(segLen*segWidth, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SW | PARASAIL_FLAG_STRIPED
        | PARASAIL_FLAG_BITS_64 | PARASAIL_FLAG_LANES_4;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvHStore = parasail_memalign___m256i(32, segLen);
    pvHLoad =  parasail_memalign___m256i(32, segLen);
    pvHMax = parasail_memalign___m256i(32, segLen);
    pvE = parasail_memalign___m256i(32, segLen);

    /* validate heap variables */
    if (!pvHStore) return NULL;
    if (!pvHLoad) return NULL;
    if (!pvHMax) return NULL;
    if (!pvE) return NULL;

    /* initialize H and E */
    parasail_memset___m256i(pvHStore, vZero, segLen);
    parasail_memset___m256i(pvE, _mm256_set1_epi64x_rpl(-open), segLen);

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m256i vE;
        __m256i vF;
        __m256i vH;
        const __m256i* vP = NULL;
        __m256i* pv = NULL;

        /* Initialize F value to 0.  Any errors to vH values will be
         * corrected in the Lazy_F loop. */
        vF = vZero;

        /* load final segment of pvHStore and shift left by 8 bytes */
        vH = _mm256_load_si256(&pvHStore[segLen - 1]);
        vH = _mm256_slli_si256_rpl(vH, 8);

        /* Correct part of the vProfile */
        vP = vProfile + matrix->mapper[(unsigned char)s2[j]] * segLen;

        if (end_ref == j-2) {
            /* Swap in the max buffer. */
            pv = pvHMax;
            pvHMax = pvHLoad;
            pvHLoad = pvHStore;
            pvHStore = pv;
        }
        else {
            /* Swap the 2 H buffers. */
            pv = pvHLoad;
            pvHLoad = pvHStore;
            pvHStore = pv;
        }

        /* inner loop to process the query sequence */
        for (i=0; i<segLen; ++i) {
            vH = _mm256_add_epi64(vH, _mm256_load_si256(vP + i));
            vE = _mm256_load_si256(pvE + i);

            /* Get max from vH, vE and vF. */
            vH = _mm256_max_epi64_rpl(vH, vE);
            vH = _mm256_max_epi64_rpl(vH, vF);
            vH = _mm256_max_epi64_rpl(vH, vZero);
            /* Save vH values. */
            _mm256_store_si256(pvHStore + i, vH);
#ifdef PARASAIL_TABLE
            arr_store_si256(result->tables->score_table, vH, i, segLen, j, s2Len);
#endif
            vMaxH = _mm256_max_epi64_rpl(vH, vMaxH);

            /* Update vE value. */
            vH = _mm256_sub_epi64(vH, vGapO);
            vE = _mm256_sub_epi64(vE, vGapE);
            vE = _mm256_max_epi64_rpl(vE, vH);
            _mm256_store_si256(pvE + i, vE);

            /* Update vF value. */
            vF = _mm256_sub_epi64(vF, vGapE);
            vF = _mm256_max_epi64_rpl(vF, vH);

            /* Load the next vH. */
            vH = _mm256_load_si256(pvHLoad + i);
        }

        /* Lazy_F loop: has been revised to disallow adjecent insertion and
         * then deletion, so don't update E(i, i), learn from SWPS3 */
        for (k=0; k<segWidth; ++k) {
            vF = _mm256_slli_si256_rpl(vF, 8);
            for (i=0; i<segLen; ++i) {
                vH = _mm256_load_si256(pvHStore + i);
                vH = _mm256_max_epi64_rpl(vH,vF);
                _mm256_store_si256(pvHStore + i, vH);
#ifdef PARASAIL_TABLE
                arr_store_si256(result->tables->score_table, vH, i, segLen, j, s2Len);
#endif
                vMaxH = _mm256_max_epi64_rpl(vH, vMaxH);
                vH = _mm256_sub_epi64(vH, vGapO);
                vF = _mm256_sub_epi64(vF, vGapE);
                if (! _mm256_movemask_epi8(_mm256_cmpgt_epi64(vF, vH))) goto end;
                /*vF = _mm256_max_epi64_rpl(vF, vH);*/
            }
        }
end:
        {
        }

#ifdef PARASAIL_ROWCOL
        /* extract last value from the column */
        {
            vH = _mm256_load_si256(pvHStore + offset);
            for (k=0; k<position; ++k) {
                vH = _mm256_slli_si256_rpl(vH, 8);
            }
            result->rowcols->score_row[j] = (int64_t) _mm256_extract_epi64_rpl (vH, 3);
        }
#endif

        {
            __m256i vCompare = _mm256_cmpgt_epi64(vMaxH, vMaxHUnit);
            if (_mm256_movemask_epi8(vCompare)) {
                score = _mm256_hmax_epi64_rpl(vMaxH);
                /* if score has potential to overflow, abort early */
                if (score > maxp) {
                    result->flag |= PARASAIL_FLAG_SATURATED;
                    break;
                }
                vMaxHUnit = _mm256_set1_epi64x_rpl(score);
                end_ref = j;
            }
        }

        /*if (score == stop) break;*/
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m256i vH = _mm256_load_si256(pvHStore+i);
        arr_store_col(result->rowcols->score_col, vH, i, segLen);
    }
#endif

    if (score == INT64_MAX) {
        result->flag |= PARASAIL_FLAG_SATURATED;
    }

    if (parasail_result_is_saturated(result)) {
        score = INT64_MAX;
        end_query = 0;
        end_ref = 0;
    }
    else {
        if (end_ref == j-1) {
            /* end_ref was the last store column */
            __m256i *pv = pvHMax;
            pvHMax = pvHStore;
            pvHStore = pv;
        }
        else if (end_ref == j-2) {
            /* end_ref was the last load column */
            __m256i *pv = pvHMax;
            pvHMax = pvHLoad;
            pvHLoad = pv;
        }
        /* Trace the alignment ending position on read. */
        {
            int64_t *t = (int64_t*)pvHMax;
            int32_t column_len = segLen * segWidth;
            end_query = s1Len - 1;
            for (i = 0; i<column_len; ++i, ++t) {
                if (*t == score) {
                    int32_t temp = i / segWidth + i % segWidth * segLen;
                    if (temp < end_query) {
                        end_query = temp;
                    }
                }
            }
        }
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(pvE);
    parasail_free(pvHMax);
    parasail_free(pvHLoad);
    parasail_free(pvHStore);

    return result;
}